

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSharedPtr.hpp
# Opt level: O0

void __thiscall
de::SharedPtr<unsigned_char>::SharedPtr<de::ArrayDeleter<unsigned_char>>
          (SharedPtr<unsigned_char> *this,uchar *ptr)

{
  SharedPtrState<unsigned_char,_de::ArrayDeleter<unsigned_char>_> *pSVar1;
  uchar *ptr_local;
  SharedPtr<unsigned_char> *this_local;
  
  this->m_ptr = (uchar *)0x0;
  this->m_state = (SharedPtrStateBase *)0x0;
  this->m_ptr = ptr;
  pSVar1 = (SharedPtrState<unsigned_char,_de::ArrayDeleter<unsigned_char>_> *)operator_new(0x20);
  SharedPtrState<unsigned_char,_de::ArrayDeleter<unsigned_char>_>::SharedPtrState(pSVar1,ptr);
  this->m_state = (SharedPtrStateBase *)pSVar1;
  this->m_state->strongRefCount = 1;
  this->m_state->weakRefCount = 1;
  return;
}

Assistant:

inline SharedPtr<T>::SharedPtr (T* ptr, Deleter deleter)
	: m_ptr		(DE_NULL)
	, m_state	(DE_NULL)
{
	try
	{
		m_ptr	= ptr;
		m_state	= new SharedPtrState<T, Deleter>(ptr, deleter);
		m_state->strongRefCount	= 1;
		m_state->weakRefCount	= 1;
	}
	catch (...)
	{
		// \note ptr is not released.
		delete m_state;
		throw;
	}
}